

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteIndent(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = xmlListSize(writer->nodes);
  iVar2 = -1;
  if ((0 < iVar1) && (iVar2 = iVar1 + -1, iVar3 = iVar2, iVar1 != 1)) {
    do {
      iVar1 = xmlOutputBufferWriteString(writer->out,(char *)writer->ichar);
      if (iVar1 == -1) {
        return -1;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return iVar2;
}

Assistant:

static int
xmlTextWriterWriteIndent(xmlTextWriterPtr writer)
{
    int lksize;
    int i;
    int ret;

    lksize = xmlListSize(writer->nodes);
    if (lksize < 1)
        return (-1);            /* list is empty */
    for (i = 0; i < (lksize - 1); i++) {
        ret = xmlOutputBufferWriteString(writer->out,
                                         (const char *) writer->ichar);
        if (ret == -1)
            return (-1);
    }

    return (lksize - 1);
}